

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_state.cpp
# Opt level: O0

void __thiscall cppurses::detail::Screen_state::Optimize::reset(Optimize *this)

{
  Optimize *this_local;
  
  this->just_enabled = false;
  this->moved = false;
  this->resized = false;
  this->child_event = false;
  Screen_mask::clear(&this->move_mask);
  Screen_mask::clear(&this->resize_mask);
  return;
}

Assistant:

void Screen_state::Optimize::reset() {
    this->just_enabled = false;
    this->moved = false;
    this->resized = false;
    this->child_event = false;
    this->move_mask.clear();
    this->resize_mask.clear();
}